

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3MallocAlarm(int nByte)

{
  int nByte_local;
  
  if (0 < mem0.alarmThreshold) {
    sqlite3_mutex_leave(mem0.mutex);
    sqlite3_release_memory(nByte);
    sqlite3_mutex_enter(mem0.mutex);
  }
  return;
}

Assistant:

static void sqlite3MallocAlarm(int nByte){
  if( mem0.alarmThreshold<=0 ) return;
  sqlite3_mutex_leave(mem0.mutex);
  sqlite3_release_memory(nByte);
  sqlite3_mutex_enter(mem0.mutex);
}